

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall
ImGui::RenderNavHighlight(ImGui *this,ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImU32 IVar12;
  float fVar13;
  float fVar15;
  ImVec2 IVar14;
  float local_9c;
  ImVec2 local_98;
  ImVec2 aIStack_90 [2];
  int local_7c;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((GImGui->NavId == (ImGuiID)bb) &&
     ((((id & 4) != 0 || (GImGui->NavDisableHighlight == false)) &&
      (pIVar1 = GImGui->CurrentWindow, (pIVar1->DC).NavHideHighlightOneFrame == false)))) {
    local_9c = 0.0;
    if ((id & 8) == 0) {
      local_9c = (GImGui->Style).FrameRounding;
    }
    local_98.x = (float)*(undefined8 *)this;
    local_98.y = (float)((ulong)*(undefined8 *)this >> 0x20);
    aIStack_90[0].x = (float)*(undefined8 *)(this + 8);
    aIStack_90[0].y = (float)((ulong)*(undefined8 *)(this + 8) >> 0x20);
    fVar4 = (pIVar1->ClipRect).Min.x;
    fVar5 = (pIVar1->ClipRect).Min.y;
    fVar6 = (pIVar1->ClipRect).Max.x;
    fVar7 = (pIVar1->ClipRect).Max.y;
    local_98.x = (float)(~-(uint)(fVar4 <= local_98.x) & (uint)fVar4 |
                        (uint)local_98.x & -(uint)(fVar4 <= local_98.x));
    local_98.y = (float)(~-(uint)(fVar5 <= local_98.y) & (uint)fVar5 |
                        (uint)local_98.y & -(uint)(fVar5 <= local_98.y));
    aIStack_90[0].x =
         (float)(~-(uint)(aIStack_90[0].x < fVar6) & (uint)fVar6 |
                (uint)aIStack_90[0].x & -(uint)(aIStack_90[0].x < fVar6));
    aIStack_90[0].y =
         (float)(~-(uint)(aIStack_90[0].y < fVar7) & (uint)fVar7 |
                (uint)aIStack_90[0].y & -(uint)(aIStack_90[0].y < fVar7));
    if ((id & 1) != 0) {
      fVar13 = local_98.x + -4.0;
      fVar15 = local_98.y + -4.0;
      aIStack_90[0].x = aIStack_90[0].x + 4.0;
      aIStack_90[0].y = aIStack_90[0].y + 4.0;
      local_98.y = fVar15;
      local_98.x = fVar13;
      auVar3._4_4_ = -(uint)(aIStack_90[0].y <= fVar7);
      auVar3._0_4_ = -(uint)(aIStack_90[0].x <= fVar6);
      auVar3._8_4_ = -(uint)(fVar4 <= fVar13);
      auVar3._12_4_ = -(uint)(fVar5 <= fVar15);
      local_7c = movmskps(flags,auVar3);
      if (local_7c == 0xf) {
        IVar14.y = aIStack_90[0].y;
        IVar14.x = aIStack_90[0].x;
      }
      else {
        local_68 = local_98;
        uStack_60 = 0;
        local_78 = aIStack_90[0];
        uStack_70 = 0;
        ImDrawList::PushClipRect(pIVar1->DrawList,local_98,aIStack_90[0],false);
        fVar13 = local_68.x;
        fVar15 = local_68.y;
        IVar14 = local_78;
      }
      pIVar2 = pIVar1->DrawList;
      local_38.y = fVar15 + 1.0;
      local_38.x = fVar13 + 1.0;
      local_40.x = IVar14.x + -1.0;
      local_40.y = IVar14.y + -1.0;
      local_58.x = (GImGui->Style).Colors[0x33].x;
      local_58.y = (GImGui->Style).Colors[0x33].y;
      uVar8 = (GImGui->Style).Colors[0x33].z;
      uVar9 = (GImGui->Style).Colors[0x33].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar9;
      local_58.z = (float)uVar8;
      IVar12 = ColorConvertFloat4ToU32(&local_58);
      ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar12,local_9c,0xf,2.0);
      if ((char)local_7c != '\x0f') {
        ImDrawList::PopClipRect(pIVar1->DrawList);
      }
    }
    if ((id & 2) != 0) {
      pIVar2 = pIVar1->DrawList;
      local_58.x = (GImGui->Style).Colors[0x33].x;
      local_58.y = (GImGui->Style).Colors[0x33].y;
      uVar10 = (GImGui->Style).Colors[0x33].z;
      uVar11 = (GImGui->Style).Colors[0x33].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar11;
      local_58.z = (float)uVar10;
      IVar12 = ColorConvertFloat4ToU32(&local_58);
      ImDrawList::AddRect(pIVar2,&local_98,aIStack_90,IVar12,local_9c,-1,1.0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}